

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O2

bool __thiscall
disruptor::SingleThreadedStrategy::HasAvailableCapacity
          (SingleThreadedStrategy *this,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          int64_t cursor,int required_capacity)

{
  int64_t iVar1;
  long lVar2;
  
  lVar2 = ((long)required_capacity + this->last_claimed_sequence_) - this->buffer_size_;
  if (this->last_consumer_sequence_ < lVar2) {
    iVar1 = GetMinimumSequence(dependents,0x7fffffffffffffff);
    this->last_consumer_sequence_ = iVar1;
    if (iVar1 < lVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool HasAvailableCapacity(const std::vector<Sequence*>& dependents,
                            int64_t cursor, int required_capacity = 1) {
    const int64_t wrap_point =
        last_claimed_sequence_ + required_capacity - buffer_size_;
    if (wrap_point > last_consumer_sequence_) {
      const int64_t min_sequence = GetMinimumSequence(dependents);
      last_consumer_sequence_ = min_sequence;
      if (wrap_point > min_sequence) return false;
    }
    return true;
  }